

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprAssignVarNumber(Parse *pParse,Expr *pExpr,u32 n)

{
  undefined2 uVar1;
  sqlite3 *db;
  char *zName;
  VList *pVVar2;
  bool bVar3;
  uint uVar4;
  int *piVar5;
  short sVar6;
  ulong uVar7;
  int iVar8;
  u32 uVar9;
  int iVar10;
  size_t __n;
  int *piVar11;
  int *piVar12;
  bool bVar13;
  i64 i;
  ulong local_50;
  ulong local_48;
  Expr *local_40;
  char *local_38;
  
  if (pExpr == (Expr *)0x0) {
    return;
  }
  db = pParse->db;
  zName = (pExpr->u).zToken;
  if ((long)zName[1] == 0) {
    uVar1 = pParse->nVar;
    sVar6 = uVar1 + 1;
    pParse->nVar = sVar6;
    goto LAB_0022e00a;
  }
  local_38 = zName;
  if (*zName == '?') {
    if (n == 2) {
      local_50 = (long)zName[1] - 0x30;
      bVar13 = false;
    }
    else {
      iVar10 = sqlite3Atoi64(zName + 1,(i64 *)&local_50,n - 1,'\x01');
      bVar13 = iVar10 != 0;
    }
    uVar7 = local_50;
    if (((long)local_50 < 1 || bVar13) || ((long)db->aLimit[9] < (long)local_50)) {
      bVar3 = false;
      sqlite3ErrorMsg(pParse,"variable number must be between ?1 and ?%d",(ulong)(uint)db->aLimit[9]
                     );
      bVar13 = false;
    }
    else {
      sVar6 = (short)local_50;
      if (pParse->nVar < sVar6) {
        pParse->nVar = sVar6;
        bVar13 = true;
        bVar3 = true;
      }
      else {
        pVVar2 = pParse->pVList;
        bVar13 = true;
        bVar3 = true;
        if (pVVar2 != (VList *)0x0) {
          iVar10 = 2;
          do {
            piVar11 = pVVar2 + iVar10;
            if (*piVar11 == (int)sVar6) {
              bVar13 = piVar11 == (int *)0xfffffffffffffff8;
              break;
            }
            iVar10 = iVar10 + piVar11[1];
          } while (iVar10 < pVVar2[1]);
        }
      }
    }
    if (bVar3) goto LAB_0022df24;
    bVar3 = false;
  }
  else {
    uVar4 = sqlite3VListNameToNum(pParse->pVList,zName,n);
    uVar7 = (ulong)uVar4;
    bVar13 = false;
    if ((short)uVar4 == 0) {
      uVar4 = *(int *)&pParse->nVar + 1;
      uVar7 = (ulong)uVar4;
      pParse->nVar = (ynVar)uVar4;
      bVar13 = true;
    }
LAB_0022df24:
    bVar3 = true;
    if (bVar13) {
      uVar9 = n + 3;
      if (-1 < (int)n) {
        uVar9 = n;
      }
      piVar11 = pParse->pVList;
      iVar10 = ((int)uVar9 >> 2) + 3;
      piVar12 = piVar11;
      local_48 = (ulong)n;
      local_40 = pExpr;
      if (piVar11 == (int *)0x0) {
        iVar8 = 10;
LAB_0022df7e:
        piVar5 = (int *)sqlite3DbRealloc(db,piVar11,(long)(iVar8 + iVar10) << 2);
        if (piVar5 != (int *)0x0) {
          if (piVar11 == (int *)0x0) {
            piVar5[1] = 2;
          }
          *piVar5 = iVar8 + iVar10;
          piVar12 = piVar5;
        }
        if (piVar5 != (int *)0x0) goto LAB_0022dfb8;
      }
      else {
        if (*piVar11 < piVar11[1] + iVar10) {
          iVar8 = *piVar11 * 2;
          goto LAB_0022df7e;
        }
LAB_0022dfb8:
        piVar11 = piVar12;
        iVar8 = piVar11[1];
        piVar12 = piVar11 + iVar8;
        *piVar12 = (int)(short)uVar7;
        piVar12[1] = iVar10;
        piVar11[1] = iVar10 + iVar8;
        __n = (size_t)(int)local_48;
        memcpy(piVar12 + 2,local_38,__n);
        *(undefined1 *)((long)piVar11 + __n + 8 + (long)iVar8 * 4) = 0;
      }
      pParse->pVList = piVar11;
      bVar3 = true;
      pExpr = local_40;
    }
  }
  sVar6 = (short)uVar7;
  if (!bVar3) {
    return;
  }
LAB_0022e00a:
  pExpr->iColumn = sVar6;
  if ((int)sVar6 <= db->aLimit[9]) {
    return;
  }
  sqlite3ErrorMsg(pParse,"too many SQL variables");
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprAssignVarNumber(Parse *pParse, Expr *pExpr, u32 n){
  sqlite3 *db = pParse->db;
  const char *z;
  ynVar x;

  if( pExpr==0 ) return;
  assert( !ExprHasProperty(pExpr, EP_IntValue|EP_Reduced|EP_TokenOnly) );
  z = pExpr->u.zToken;
  assert( z!=0 );
  assert( z[0]!=0 );
  assert( n==(u32)sqlite3Strlen30(z) );
  if( z[1]==0 ){
    /* Wildcard of the form "?".  Assign the next variable number */
    assert( z[0]=='?' );
    x = (ynVar)(++pParse->nVar);
  }else{
    int doAdd = 0;
    if( z[0]=='?' ){
      /* Wildcard of the form "?nnn".  Convert "nnn" to an integer and
      ** use it as the variable number */
      i64 i;
      int bOk;
      if( n==2 ){ /*OPTIMIZATION-IF-TRUE*/
        i = z[1]-'0';  /* The common case of ?N for a single digit N */
        bOk = 1;
      }else{
        bOk = 0==sqlite3Atoi64(&z[1], &i, n-1, SQLITE_UTF8);
      }
      testcase( i==0 );
      testcase( i==1 );
      testcase( i==db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER]-1 );
      testcase( i==db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER] );
      if( bOk==0 || i<1 || i>db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER] ){
        sqlite3ErrorMsg(pParse, "variable number must be between ?1 and ?%d",
            db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER]);
        return;
      }
      x = (ynVar)i;
      if( x>pParse->nVar ){
        pParse->nVar = (int)x;
        doAdd = 1;
      }else if( sqlite3VListNumToName(pParse->pVList, x)==0 ){
        doAdd = 1;
      }
    }else{
      /* Wildcards like ":aaa", "$aaa" or "@aaa".  Reuse the same variable
      ** number as the prior appearance of the same name, or if the name
      ** has never appeared before, reuse the same variable number
      */
      x = (ynVar)sqlite3VListNameToNum(pParse->pVList, z, n);
      if( x==0 ){
        x = (ynVar)(++pParse->nVar);
        doAdd = 1;
      }
    }
    if( doAdd ){
      pParse->pVList = sqlite3VListAdd(db, pParse->pVList, z, n, x);
    }
  }
  pExpr->iColumn = x;
  if( x>db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER] ){
    sqlite3ErrorMsg(pParse, "too many SQL variables");
  }
}